

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

size_t __thiscall websocketpp::http::parser::parser::process_body(parser *this,char *buf,size_t len)

{
  exception *peVar1;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->m_body_encoding == plain) {
    if (this->m_body_bytes_needed < len) {
      len = this->m_body_bytes_needed;
    }
    std::__cxx11::string::append((char *)&this->m_body,(ulong)buf);
    this->m_body_bytes_needed = this->m_body_bytes_needed - len;
    return len;
  }
  if (this->m_body_encoding == chunked) {
    peVar1 = (exception *)__cxa_allocate_exception(0x70);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Unexpected body encoding","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    exception::exception(peVar1,&local_90,internal_server_error,&local_50,&local_70);
    __cxa_throw(peVar1,&exception::typeinfo,exception::~exception);
  }
  peVar1 = (exception *)__cxa_allocate_exception(0x70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Unexpected body encoding","")
  ;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  exception::exception(peVar1,&local_90,internal_server_error,&local_50,&local_70);
  __cxa_throw(peVar1,&exception::typeinfo,exception::~exception);
}

Assistant:

inline size_t parser::process_body(char const * buf, size_t len) {
    if (m_body_encoding == body_encoding::plain) {
        size_t processed = (std::min)(m_body_bytes_needed,len);
        m_body.append(buf,processed);
        m_body_bytes_needed -= processed;
        return processed;
    } else if (m_body_encoding == body_encoding::chunked) {
        // TODO: 
        throw exception("Unexpected body encoding",
            status_code::internal_server_error);
    } else {
        throw exception("Unexpected body encoding",
            status_code::internal_server_error);
    }
}